

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O0

void __thiscall FloatingDisplay::saveSettings(FloatingDisplay *this)

{
  int iVar1;
  Master *this_00;
  QSettings *pQVar2;
  QRect *pQVar3;
  double dVar4;
  QVariant local_98;
  QString local_78;
  QVariant local_50;
  QString local_30;
  QSettings *local_18;
  QSettings *settings;
  FloatingDisplay *this_local;
  
  settings = (QSettings *)this;
  this_00 = Master::getInstance();
  pQVar2 = Master::getSettings(this_00);
  local_18 = pQVar2;
  QString::QString(&local_30,"FloatingDisplay/geometry");
  pQVar3 = QWidget::geometry((QWidget *)this);
  QVariant::QVariant(&local_50,(QRect *)pQVar3);
  QSettings::setValue((QString *)pQVar2,(QVariant *)&local_30);
  QVariant::~QVariant(&local_50);
  QString::~QString(&local_30);
  pQVar2 = local_18;
  QString::QString(&local_78,"FloatingDisplay/opacity");
  dVar4 = (double)QWidget::windowOpacity();
  iVar1 = qRound(dVar4 * 100.0);
  QVariant::QVariant(&local_98,iVar1);
  QSettings::setValue((QString *)pQVar2,(QVariant *)&local_78);
  QVariant::~QVariant(&local_98);
  QString::~QString(&local_78);
  return;
}

Assistant:

void FloatingDisplay::saveSettings() {
	QSettings *settings = Master::getInstance()->getSettings();
	settings->setValue("FloatingDisplay/geometry", geometry());
	settings->setValue("FloatingDisplay/opacity", qRound(windowOpacity() * 100.0));
}